

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  ulong nbRows;
  ulong nbCols;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  Index innerSize;
  undefined8 *puVar4;
  Index outerSize;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  Index row;
  long lVar9;
  uint uVar10;
  
  nbRows = *(ulong *)other;
  nbCols = *(ulong *)(other + 8);
  bVar7 = nbCols == 0 || nbRows == 0;
  if ((bVar7) ||
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar5 = SUB168(auVar3 % SEXT816((long)nbCols),0),
     (long)nbRows <= SUB168(auVar3 / SEXT816((long)nbCols),0))) {
    if ((long)(nbCols | nbRows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar7) ||
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar5 = SUB168(auVar3 % SEXT816((long)nbCols),0),
       (long)nbRows <= SUB168(auVar3 / SEXT816((long)nbCols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
      lVar1 = *(long *)(this + 8);
      if ((lVar1 == *(long *)other) &&
         (lVar2 = *(long *)(this + 0x10), lVar2 == *(long *)(other + 8))) {
        if (0 < lVar2) {
          lVar6 = *(long *)this;
          lVar8 = 0;
          do {
            if (0 < lVar1) {
              lVar9 = 0;
              do {
                uVar10 = 0x3ff00000;
                if (lVar8 != lVar9) {
                  uVar10 = 0;
                }
                *(ulong *)(lVar6 + lVar9 * 8) = (ulong)uVar10 << 0x20;
                lVar9 = lVar9 + 1;
              } while (lVar1 != lVar9);
            }
            lVar8 = lVar8 + 1;
            lVar6 = lVar6 + lVar1 * 8;
          } while (lVar8 != lVar2);
        }
        return (Matrix<double,__1,__1,_0,__1,__1> *)this;
      }
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,
                    "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8,bVar7,uVar5);
  *puVar4 = operator_delete;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }